

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,QChar c)

{
  QTextStreamPrivate *this_00;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *d;
  char *in_stack_ffffffffffffff98;
  QTextStreamPrivate *in_stack_ffffffffffffffa0;
  QTextStream *local_40;
  QMessageLogger local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextStream *)0x4abd62);
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)in_RDI,
               (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),in_stack_ffffffffffffff98);
    QMessageLogger::warning(&local_30,"QTextStream: No device");
    local_40 = in_RDI;
  }
  else {
    QTextStreamPrivate::putChar(in_stack_ffffffffffffffa0,(QChar)(char16_t)((ulong)in_RDI >> 0x30));
    local_40 = in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(QChar c)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->putChar(c);
    return *this;
}